

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  float fVar1;
  undefined1 auVar2 [16];
  real *prVar3;
  EncounteredNaNError *this_00;
  int j;
  long j_00;
  double dVar4;
  undefined1 auVar5 [64];
  
  auVar5 = ZEXT864(0) << 0x40;
  for (j_00 = 0; dVar4 = auVar5._0_8_, j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
    prVar3 = at(this,i,j_00);
    fVar1 = *prVar3;
    prVar3 = at(this,i,j_00);
    auVar5 = ZEXT864((ulong)(dVar4 + (double)(fVar1 * *prVar3)));
  }
  if (!NAN(dVar4)) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar5._0_16_,auVar5._0_16_);
      dVar4 = auVar2._0_8_;
    }
    return (float)dVar4;
  }
  this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
  EncounteredNaNError::EncounteredNaNError(this_00);
  __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw EncounteredNaNError();
  }
  return std::sqrt(norm);
}